

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

int QStyle::sliderValueFromPosition(int min,int max,int pos,int span,bool upsideDown)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < pos && 0 < span) {
    if ((uint)span <= (uint)pos) {
      if (upsideDown) {
        return min;
      }
      return max;
    }
    uVar2 = (long)max - (long)min;
    uVar3 = (ulong)(uint)span;
    if ((long)uVar3 <= (long)uVar2) {
      iVar1 = (int)(((ulong)(uint)((int)((uVar2 & 0xffffffff) % (ulong)(uint)span) * 2) *
                     (ulong)(uint)pos + uVar3) / (uVar3 * 2)) +
              (int)((uVar2 & 0xffffffff) / (ulong)(uint)span) * pos;
      if (!upsideDown) {
        return iVar1 + min;
      }
      return max - iVar1;
    }
    iVar1 = (int)((long)(uVar3 + uVar2 * (uint)pos * 2) / (long)(uVar3 * 2));
    max = max - iVar1;
    min = min + iVar1;
  }
  if (upsideDown) {
    min = max;
  }
  return min;
}

Assistant:

int QStyle::sliderValueFromPosition(int min, int max, int pos, int span, bool upsideDown)
{
    if (span <= 0 || pos <= 0)
        return upsideDown ? max : min;
    if (pos >= span)
        return upsideDown ? min : max;

    const qint64 range = qint64(max) - min;

    if (q20::cmp_greater(span, range)) {
        const int tmp = (2 * range * pos + span) / (qint64(2) * span);
        return upsideDown ? max - tmp : tmp + min;
    } else {
        const qint64 div = range / span;
        const qint64 mod = range % span;
        const int tmp = pos * div + (2 * mod * pos + span) / (qint64(2) * span);
        return upsideDown ? max - tmp : tmp + min;
    }
    // equiv. to min + (pos*range)/span + 0.5
    // no overflow because of this implicit assumption:
    // pos <= span < sqrt(INT_MAX+0.0625)+0.25 ~ sqrt(INT_MAX)
}